

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O0

void __thiscall
bubbleJson::BubbleJson::StringifyValue
          (BubbleJson *this,BubbleValue *value,StringifyTypes stringifyType,int tabCount)

{
  ValueTypes VVar1;
  int iVar2;
  char *pcVar3;
  size_t length;
  int tabCount_local;
  StringifyTypes stringifyType_local;
  BubbleValue *value_local;
  BubbleJson *this_local;
  
  VVar1 = BubbleValue::GetType(value);
  switch(VVar1) {
  case ValueType_Null:
    ContextPushString(this,"null",4);
    break;
  case ValueType_False:
    ContextPushString(this,"false",5);
    break;
  case ValueType_True:
    ContextPushString(this,"true",4);
    break;
  case ValueType_Number:
    pcVar3 = (char *)ContextPush(this,0x20);
    BubbleValue::GetNumber(value);
    iVar2 = sprintf(pcVar3,"%.17g");
    this->context->top = this->context->top - (long)(0x20 - iVar2);
    break;
  case ValueType_String:
    ContextPushChar(this,'\"');
    pcVar3 = BubbleValue::GetString(value);
    length = BubbleValue::GetStringLength(value);
    ContextPushString(this,pcVar3,length);
    ContextPushChar(this,'\"');
    break;
  case ValueType_Array:
    StringifyArray(this,value,stringifyType,tabCount);
    break;
  case ValueType_Object:
    StringifyObject(this,value,stringifyType,tabCount);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/BubbleJSON/BubbleJson.cpp"
                  ,0x1f5,
                  "void bubbleJson::BubbleJson::StringifyValue(BubbleValue *, StringifyTypes, int)")
    ;
  }
  return;
}

Assistant:

void BubbleJson::StringifyValue(BubbleValue *value, StringifyTypes stringifyType, int tabCount)
{
    switch (value->GetType())
    {
        case ValueType_Null:    ContextPushString("null", 4); break;
        case ValueType_True:    ContextPushString("true", 4); break;
        case ValueType_False:   ContextPushString("false", 5); break;
        case ValueType_Number:
            //assume it took 32byte, then reclaim unused memory
            this->context->top -= 32 - sprintf((char*)ContextPush(32), "%.17g", value->GetNumber());
            break;
        case ValueType_String:
            ContextPushChar('\"');
            ContextPushString(value->GetString(), value->GetStringLength());
            ContextPushChar('\"');
            break;
        case ValueType_Object:
            StringifyObject(value, stringifyType, tabCount);
            break;
        case ValueType_Array:
            StringifyArray(value, stringifyType, tabCount);
            break;
        default:
            assert(false);
    }
}